

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuFloatFormat.cpp
# Opt level: O2

void __thiscall tcu::anon_unknown_4::Test::testULP(Test *this,double arg,double ref)

{
  ostream *poVar1;
  string *expr;
  double result;
  ostringstream oss;
  Test local_1a8 [2];
  ostringstream local_188 [8];
  string local_180 [11];
  
  std::__cxx11::ostringstream::ostringstream(local_188);
  std::operator<<((ostream *)local_188,"ulp(");
  poVar1 = std::ostream::_M_insert<double>(arg);
  std::operator<<(poVar1,")");
  expr = local_180;
  std::__cxx11::stringbuf::str();
  result = FloatFormat::ulp((this->m_fmt).
                            super_UniqueBase<tcu::FloatFormat,_de::DefaultDeleter<tcu::FloatFormat>_>
                            .m_data.ptr,arg,1.0);
  check(local_1a8,expr,result,ref);
  std::__cxx11::string::~string((string *)local_1a8);
  std::__cxx11::ostringstream::~ostringstream(local_188);
  return;
}

Assistant:

void Test::testULP (double arg, double ref) const
{
	ostringstream	oss;

	oss << "ulp(" << arg << ")";
	check(oss.str(), m_fmt->ulp(arg), ref);
}